

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O0

void __thiscall
so_5::impl::coop_repository_basis_t::next_coop_reg_step__parent_child_relation
          (coop_repository_basis_t *this,coop_ref_t *coop_ref,coop_t *parent_coop_ptr)

{
  anon_class_16_2_f8351835 rollback_action;
  string *__a;
  element_type *this_00;
  string *__b;
  undefined1 local_70 [8];
  parent_child_coop_names_t names;
  anon_class_16_2_1414b27b do_actions;
  coop_t *parent_coop_ptr_local;
  coop_ref_t *coop_ref_local;
  coop_repository_basis_t *this_local;
  
  do_actions.coop_ref = (coop_ref_t *)&do_actions.parent_coop_ptr;
  names._56_8_ = coop_ref;
  do_actions.parent_coop_ptr = (coop_t **)parent_coop_ptr;
  if (parent_coop_ptr == (coop_t *)0x0) {
    next_coop_reg_step__parent_child_relation::anon_class_16_2_1414b27b::operator()
              ((anon_class_16_2_1414b27b *)&names.field_0x38);
  }
  else {
    __a = coop_t::query_coop_name_abi_cxx11_(parent_coop_ptr);
    this_00 = std::__shared_ptr_access<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)coop_ref);
    __b = coop_t::query_coop_name_abi_cxx11_(this_00);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,__a,__b);
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert(&this->m_parent_child_relations,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_70);
    rollback_action.names = (parent_child_coop_names_t *)local_70;
    rollback_action.this = this;
    details::
    do_with_rollback_on_exception<so_5::impl::coop_repository_basis_t::next_coop_reg_step__parent_child_relation(std::shared_ptr<so_5::coop_t>const&,so_5::coop_t*)::__0,so_5::impl::coop_repository_basis_t::next_coop_reg_step__parent_child_relation(std::shared_ptr<so_5::coop_t>const&,so_5::coop_t*)::__1>
              ((anon_class_8_1_9b248b07)&names.field_0x38,rollback_action);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_70);
  }
  return;
}

Assistant:

void
coop_repository_basis_t::next_coop_reg_step__parent_child_relation(
	const coop_ref_t & coop_ref,
	coop_t * parent_coop_ptr )
{
	auto do_actions = [&] {
			coop_private_iface_t::do_registration_specific_actions(
				*coop_ref, parent_coop_ptr );
		};

	if( parent_coop_ptr )
	{
		const parent_child_coop_names_t names{
				parent_coop_ptr->query_coop_name(),
				coop_ref->query_coop_name() };

		m_parent_child_relations.insert( names );

		// In case of error cooperation relation info should be removed
		// from m_parent_child_relations.
		so_5::details::do_with_rollback_on_exception(
			[&] { do_actions(); },
			[&] { m_parent_child_relations.erase( names ); } );
	}
	else
		// It is a very simple case. There is no need for additional
		// actions and rollback on exceptions.
		do_actions();
}